

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

void despot::option::PrintUsageImplementation::printUsage
               (IStringWriter *write,Descriptor *usage,int width,int last_column_min_percent,
               int last_column_own_line_max_percent)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int i;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  LineWrapper *this;
  uint uVar10;
  ulong uVar11;
  int x;
  uint local_27c;
  LinePartIterator local_278;
  int local_234;
  int local_230;
  int _;
  int col_width [8];
  int tabstop [8];
  LineWrapper lastColumnLineWrapper;
  LineWrapper interjectionLineWrapper;
  
  uVar5 = 10000;
  if ((uint)width < 10000) {
    uVar5 = width;
  }
  local_27c = 0x50;
  if (0 < width) {
    local_27c = uVar5;
  }
  local_230 = (int)(last_column_min_percent * local_27c + 0x32) / 100;
  local_234 = (int)(last_column_own_line_max_percent * local_27c + 0x32) / 100;
  if (last_column_own_line_max_percent * local_27c + 0x95 < 199) {
    local_234 = 1;
  }
  local_278.rowdesc = (Descriptor *)0x0;
  local_278.rowstart = (char *)0x0;
  local_278.ptr = (char *)0x0;
  local_278.col = 0xffffffff;
  local_278.len = 0;
  local_278.max_line_in_block = 0;
  local_278.line_in_block = 0;
  local_278.target_line_in_block = 0;
  local_278.hit_target_line = true;
  local_278.tablestart = usage;
  while (uVar5 = local_27c, bVar2 = LinePartIterator::nextTable(&local_278), bVar2) {
    iVar4 = 10000;
    do {
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
        col_width[lVar6] = 0;
      }
      local_278.rowdesc = local_278.tablestart;
      local_278.rowstart = (local_278.tablestart)->help;
      local_278.ptr = (char *)0x0;
      uVar11 = 0;
      while (bVar2 = LinePartIterator::nextRow(&local_278), bVar2) {
        while (bVar2 = LinePartIterator::next(&local_278), bVar2) {
          lVar6 = (long)local_278.col;
          if (lVar6 < 8) {
            if ((int)uVar11 <= local_278.col) {
              uVar11 = (ulong)(uint)local_278.col;
            }
            if ((local_278.screenlen < iVar4) &&
               (((0 < local_278.col || (0 < local_278.target_line_in_block)) ||
                ((byte)(local_278.ptr[local_278.len] | 2U) == 0xb)))) {
              iVar9 = local_278.screenlen;
              if (local_278.screenlen < col_width[lVar6]) {
                iVar9 = col_width[lVar6];
              }
              col_width[lVar6] = iVar9;
            }
          }
        }
      }
      uVar7 = 0;
      uVar10 = (uint)uVar11;
      uVar8 = 0;
      if (0 < (int)uVar10) {
        uVar8 = uVar11;
      }
      iVar4 = 0;
      iVar9 = 0;
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        iVar1 = col_width[uVar7];
        iVar9 = iVar9 + iVar1;
        if (iVar4 <= iVar1) {
          iVar4 = iVar1;
        }
      }
    } while ((int)uVar5 < iVar9);
    tabstop[0] = 0;
    iVar4 = 0;
    for (lVar6 = 1; lVar6 != 8; lVar6 = lVar6 + 1) {
      iVar4 = iVar4 + col_width[lVar6 + -1];
      tabstop[lVar6] = iVar4;
    }
    lastColumnLineWrapper.width = uVar5 - tabstop[uVar11];
    if (lastColumnLineWrapper.width < local_230) {
      bVar2 = lastColumnLineWrapper.width < col_width[uVar11];
      if (lastColumnLineWrapper.width < col_width[uVar11]) {
        lastColumnLineWrapper.width = local_234;
      }
    }
    else {
      bVar2 = false;
    }
    iVar4 = uVar5 - lastColumnLineWrapper.width;
    lastColumnLineWrapper.head = 0;
    lastColumnLineWrapper.tail = 0xf;
    if (lastColumnLineWrapper.width < 2) {
      lastColumnLineWrapper.width = 2;
    }
    interjectionLineWrapper.x = 0;
    interjectionLineWrapper.width = local_27c;
    interjectionLineWrapper.head = 0;
    interjectionLineWrapper.tail = 0xf;
    if (local_27c < 2) {
      interjectionLineWrapper.width = 2;
    }
    local_278.rowdesc = local_278.tablestart;
    local_278.rowstart = (local_278.tablestart)->help;
    local_278.ptr = (char *)0x0;
    bVar2 = (bool)(uVar10 != 0 & bVar2);
    lastColumnLineWrapper.x = iVar4;
    while (bVar3 = LinePartIterator::nextRow(&local_278), bVar3) {
      x = -1;
      while (bVar3 = LinePartIterator::next(&local_278), bVar3) {
        if (local_278.col <= (int)uVar10) {
          uVar5 = local_278.col;
          if (local_278.col == 0) {
            if (x < 0) {
              uVar5 = 0;
            }
            else {
              (*write->_vptr_IStringWriter[2])(write,"\n",1);
              uVar5 = local_278.col;
            }
            x = 0;
          }
          indent(write,&x,tabstop[(int)uVar5]);
          if ((local_278.col < (int)uVar10) &&
             (((0 < local_278.col || (0 < local_278.target_line_in_block)) ||
              ((byte)(local_278.ptr[local_278.len] | 2U) == 0xb)))) {
            (*write->_vptr_IStringWriter[2])(write);
            x = x + local_278.screenlen;
          }
          else if (!bVar2) {
            this = &lastColumnLineWrapper;
            if (local_278.col == 0) {
              this = &interjectionLineWrapper;
            }
            LineWrapper::process(this,write,local_278.ptr,local_278.len);
          }
        }
      }
      if (bVar2) {
        local_278.ptr = local_278.rowstart;
        local_278.col = 0xffffffff;
        local_278.len = 0;
        local_278.screenlen = 0;
        local_278.max_line_in_block = 0;
        local_278.line_in_block = 0;
        local_278.target_line_in_block = 0;
        local_278.hit_target_line = true;
        while (bVar3 = LinePartIterator::next(&local_278), bVar3) {
          if (local_278.col == uVar10) {
            (*write->_vptr_IStringWriter[2])(write,"\n",1);
            _ = 0;
            indent(write,&_,iVar4);
            LineWrapper::process(&lastColumnLineWrapper,write,local_278.ptr,local_278.len);
          }
        }
      }
      (*write->_vptr_IStringWriter[2])(write,"\n",1);
      LineWrapper::flush(&lastColumnLineWrapper,write);
      LineWrapper::flush(&interjectionLineWrapper,write);
    }
  }
  return;
}

Assistant:

static void printUsage(IStringWriter& write, const Descriptor usage[],
		int width = 80, //
		int last_column_min_percent = 50, int last_column_own_line_max_percent =
			75) {
		if (width < 1) // protect against nonsense values
			width = 80;

		if (width > 10000) // protect against overflow in the following computation
			width = 10000;

		int last_column_min_width = ((width * last_column_min_percent) + 50)
			/ 100;
		int last_column_own_line_max_width = ((width
			* last_column_own_line_max_percent) + 50) / 100;
		if (last_column_own_line_max_width == 0)
			last_column_own_line_max_width = 1;

		LinePartIterator part(usage);
		while (part.nextTable()) {

			/***************** Determine column widths *******************************/

			const int maxcolumns = 8; // 8 columns are enough for everyone
			int col_width[maxcolumns];
			int lastcolumn;
			int leftwidth;
			int overlong_column_threshold = 10000;
			do {
				lastcolumn = 0;
				for (int i = 0; i < maxcolumns; ++i)
					col_width[i] = 0;

				part.restartTable();
				while (part.nextRow()) {
					while (part.next()) {
						if (part.column() < maxcolumns) {
							upmax(lastcolumn, part.column());
							if (part.screenLength() < overlong_column_threshold)
								// We don't let rows that don't use table separators (\t or \v) influence
								// the width of column 0. This allows the user to interject section headers
								// or explanatory paragraphs that do not participate in the table layout.
								if (part.column() > 0 || part.line() > 0
									|| part.data()[part.length()] == '\t'
									|| part.data()[part.length()] == '\v')
									upmax(col_width[part.column()],
										part.screenLength());
						}
					}
				}

				/*
				 * If the last column doesn't fit on the same
				 * line as the other columns, we can fix that by starting it on its own line.
				 * However we can't do this for any of the columns 0..lastcolumn-1.
				 * If their sum exceeds the maximum width we try to fix this by iteratively
				 * ignoring the widest line parts in the width determination until
				 * we arrive at a series of column widths that fit into one line.
				 * The result is a layout where everything is nicely formatted
				 * except for a few overlong fragments.
				 * */

				leftwidth = 0;
				overlong_column_threshold = 0;
				for (int i = 0; i < lastcolumn; ++i) {
					leftwidth += col_width[i];
					upmax(overlong_column_threshold, col_width[i]);
				}

			} while (leftwidth > width);

			/**************** Determine tab stops and last column handling **********************/

			int tabstop[maxcolumns];
			tabstop[0] = 0;
			for (int i = 1; i < maxcolumns; ++i)
				tabstop[i] = tabstop[i - 1] + col_width[i - 1];

			int rightwidth = width - tabstop[lastcolumn];
			bool print_last_column_on_own_line = false;
			if (rightwidth < last_column_min_width
				&& rightwidth < col_width[lastcolumn]) {
				print_last_column_on_own_line = true;
				rightwidth = last_column_own_line_max_width;
			}

			// If lastcolumn == 0 we must disable print_last_column_on_own_line because
			// otherwise 2 copies of the last (and only) column would be output.
			// Actually this is just defensive programming. It is currently not
			// possible that lastcolumn==0 and print_last_column_on_own_line==true
			// at the same time, because lastcolumn==0 => tabstop[lastcolumn] == 0 =>
			// rightwidth==width => rightwidth>=last_column_min_width  (unless someone passes
			// a bullshit value >100 for last_column_min_percent) => the above if condition
			// is false => print_last_column_on_own_line==false
			if (lastcolumn == 0)
				print_last_column_on_own_line = false;

			LineWrapper lastColumnLineWrapper(width - rightwidth, width);
			LineWrapper interjectionLineWrapper(0, width);

			part.restartTable();

			/***************** Print out all rows of the table *************************************/

			while (part.nextRow()) {
				int x = -1;
				while (part.next()) {
					if (part.column() > lastcolumn)
						continue; // drop excess columns (can happen if lastcolumn == maxcolumns-1)

					if (part.column() == 0) {
						if (x >= 0)
							write("\n", 1);
						x = 0;
					}

					indent(write, x, tabstop[part.column()]);

					if ((part.column() < lastcolumn)
						&& (part.column() > 0 || part.line() > 0
							|| part.data()[part.length()] == '\t'
							|| part.data()[part.length()] == '\v')) {
						write(part.data(), part.length());
						x += part.screenLength();
					} else // either part.column() == lastcolumn or we are in the special case of
						   // an interjection that doesn't contain \v or \t
					{
						// NOTE: This code block is not necessarily executed for
						// each line, because some rows may have fewer columns.

						LineWrapper& lineWrapper =
							(part.column() == 0) ?
								interjectionLineWrapper : lastColumnLineWrapper;

						if (!print_last_column_on_own_line)
							lineWrapper.process(write, part.data(),
								part.length());
					}
				} // while

				if (print_last_column_on_own_line) {
					part.restartRow();
					while (part.next()) {
						if (part.column() == lastcolumn) {
							write("\n", 1);
							int _ = 0;
							indent(write, _, width - rightwidth);
							lastColumnLineWrapper.process(write, part.data(),
								part.length());
						}
					}
				}

				write("\n", 1);
				lastColumnLineWrapper.flush(write);
				interjectionLineWrapper.flush(write);
			}
		}
	}